

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O0

void __thiscall libebml::EbmlCrc32::FillCRC32(EbmlCrc32 *this,binary *s,uint32 n)

{
  uint32 n_local;
  binary *s_local;
  EbmlCrc32 *this_local;
  
  ResetCRC(this);
  Update(this,s,n);
  Finalize(this);
  return;
}

Assistant:

void EbmlCrc32::FillCRC32(const binary *s, uint32 n)
{
  ResetCRC();
  Update(s, n);
  Finalize();

  /*uint32 crc = CRC32_NEGL;

  for(; !IsAligned<uint32>(s) && n > 0; n--)
    crc = m_tab[CRC32_INDEX(crc) ^ *s++] ^ CRC32_SHIFTED(crc);

  while (n >= 4)
  {
    crc ^= *(const uint32 *)s;
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    n -= 4;
    s += 4;
  }

  while (n--)
    crc = m_tab[CRC32_INDEX(crc) ^ *s++] ^ CRC32_SHIFTED(crc);

  m_crc = crc;

  //Now we finalize the CRC32
  m_crc ^= CRC32_NEGL;
  //for (unsigned int i = 0; i < 4; i++)
  //  (&last_crc32)[i] = GetCrcByte(i);*/

}